

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

int as154(double *inp,int N,int optmethod,int p,int d,int q,double *phi,double *theta,double *wmean,
         double *var,double *resid,double *loglik,double *hess,int cssml)

{
  double dVar1;
  double *oup;
  double *pdVar2;
  double *pdVar3;
  alik_object object;
  double *col;
  double *dx_00;
  int *ipiv_00;
  undefined1 local_e8 [8];
  custom_function as154_min;
  reg_object fit;
  alik_object obj;
  double coeff;
  double sigma;
  double maxstep;
  int *ipiv;
  double *res;
  double *varcovar;
  double *thess;
  double *dx;
  double *x;
  double *tf;
  double *b;
  int ERR;
  int Q;
  int P;
  int rp;
  int ret;
  int length;
  int retval;
  int pq;
  int i;
  int q_local;
  int d_local;
  int p_local;
  int optmethod_local;
  int N_local;
  double *inp_local;
  
  pq = q;
  i = d;
  q_local = p;
  d_local = optmethod;
  p_local = N;
  _optmethod_local = inp;
  oup = (double *)malloc((long)(N - d) << 3);
  rp = p_local;
  obj = (alik_object)0x0;
  if (cssml == 1) {
    css(_optmethod_local,p_local,d_local,q_local,i,pq,phi,theta,wmean,var,resid,loglik,hess);
    ERR = 0;
    b._4_4_ = 0;
    b._0_4_ = checkroots_cerr(phi,&q_local,theta,&pq,(double *)0x0,&ERR,(double *)0x0,
                              (int *)((long)&b + 4));
    if ((int)b == 10) {
      return 10;
    }
    if ((int)b == 0xc) {
      return 0xc;
    }
    obj = (alik_object)*wmean;
  }
  else {
    for (retval = 0; retval < q_local; retval = retval + 1) {
      phi[retval] = 0.0;
    }
    for (retval = 0; retval < pq; retval = retval + 1) {
      theta[retval] = 0.0;
    }
  }
  if (i < 1) {
    for (retval = 0; retval < p_local; retval = retval + 1) {
      oup[retval] = _optmethod_local[retval];
    }
  }
  else {
    p_local = diff(_optmethod_local,p_local,i,oup);
  }
  if (((q_local + pq == 0) && (i == 0)) && (cssml == 1)) {
    free(oup);
    inp_local._4_4_ = 1;
  }
  else {
    if (i == 0) {
      Q = 1;
      pdVar2 = (double *)malloc(8);
      pdVar3 = (double *)malloc((long)p_local << 3);
      as154_min.params = reg_init(p_local,Q);
      setIntercept((reg_object)as154_min.params,1);
      regress((reg_object)as154_min.params,(double *)0x0,oup,pdVar3,pdVar2,0.95);
      obj = *(alik_object *)((long)as154_min.params + 0xb0);
      free(pdVar2);
      free(pdVar3);
      free_reg((reg_object)as154_min.params);
    }
    object = alik_init(q_local,i,pq,p_local);
    object->N = p_local;
    length = object->pq;
    pdVar2 = (double *)malloc((long)length << 3);
    pdVar3 = (double *)malloc((long)length << 3);
    col = (double *)malloc((long)length * 8 * (long)length);
    dx_00 = (double *)malloc((long)length << 3);
    ipiv_00 = (int *)malloc((long)length << 2);
    for (retval = 0; retval < q_local; retval = retval + 1) {
      pdVar2[retval] = phi[retval];
    }
    for (retval = 0; retval < pq; retval = retval + 1) {
      pdVar2[q_local + retval] = -theta[retval];
    }
    if (object->M == 1) {
      pdVar2[q_local + pq] = (double)obj;
    }
    object->mean = (double)obj;
    for (retval = 0; retval < p_local; retval = retval + 1) {
      dVar1 = oup[retval];
      object->x[p_local * 2 + retval] = dVar1;
      object->x[retval] = dVar1;
    }
    for (retval = p_local; SBORROW4(retval,p_local * 2) != retval + p_local * -2 < 0;
        retval = retval + 1) {
      object->x[retval] = 0.0;
    }
    local_e8 = (undefined1  [8])fas154;
    as154_min.funcpt = (_func_double_double_ptr_int_void_ptr *)object;
    ret = fminunc((custom_function *)local_e8,(custom_gradient *)0x0,length,pdVar2,1.0,d_local,
                  pdVar3);
    if (ret == 0) {
      P = 0;
    }
    else if (ret == 0xf) {
      P = 0xf;
    }
    else if (ret == 4) {
      P = 4;
    }
    else {
      P = 1;
    }
    for (retval = 0; retval < length; retval = retval + 1) {
      dx_00[retval] = 1.0;
    }
    if (0 < pq) {
      invertroot(pq,pdVar3 + q_local);
    }
    hessian_fd((custom_function *)local_e8,pdVar3,length,dx_00,object->eps,hess);
    mtranspose(hess,length,length,col);
    for (retval = 0; retval < length * length; retval = retval + 1) {
      col[retval] = (double)(rp - i) * 0.5 * (hess[retval] + col[retval]);
    }
    ludecomp(col,length,ipiv_00);
    minverse(col,length,ipiv_00,hess);
    for (retval = 0; retval < q_local; retval = retval + 1) {
      phi[retval] = pdVar3[retval];
    }
    for (retval = 0; retval < pq; retval = retval + 1) {
      theta[retval] = -pdVar3[q_local + retval];
    }
    if (object->M == 1) {
      *wmean = pdVar3[q_local + pq];
    }
    else {
      *wmean = 0.0;
    }
    *var = object->ssq / (double)p_local;
    for (retval = 0; retval < rp - i; retval = retval + 1) {
      resid[retval] = object->x[p_local + retval];
    }
    *loglik = object->loglik;
    free(pdVar2);
    free(pdVar3);
    free(oup);
    free(col);
    free(ipiv_00);
    free(dx_00);
    free_alik(object);
    inp_local._4_4_ = P;
  }
  return inp_local._4_4_;
}

Assistant:

int as154(double *inp, int N, int optmethod, int p, int d, int q, double *phi, double *theta, double *wmean, double *var,
	double *resid,double *loglik,double *hess, int cssml) {
	int i,pq,retval,length,ret,rp,P,Q,ERR;
	double *b,*tf,*x,*dx,*thess,*varcovar,*res;
	int *ipiv;
	double maxstep,sigma,coeff;
	alik_object obj;
	reg_object fit;
	//custom_function as154_min;

	x = (double*)malloc(sizeof(double)* (N - d));

	length = N;
	
	maxstep = 1.0;

	coeff = 0.0;
	sigma = 1.0;

	if (cssml == 1) {
		css(inp, N, optmethod, p, d, q, phi, theta, wmean, var,resid,loglik,hess);
		P = 0;
		Q = 0;

		ERR = checkroots_cerr(phi, &p, theta, &q, NULL, &P, NULL, &Q);
		if (ERR == 10 || ERR == 12) return ERR;

		coeff = *wmean;
	}
	else {
		for (i = 0; i < p; ++i) phi[i] = 0.0;
		for (i = 0; i < q; ++i) theta[i] = 0.0;
	}


	if (d > 0) {
		N = diff(inp, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp[i];
		}
	}

	if (p + q == 0 && d == 0 && cssml == 1) {
		free(x);
		//free_alik(obj);
		return 1;
	}

	if (d == 0) {
		rp = 1;
		varcovar = (double*)malloc(sizeof(double) * rp * rp);
		res = (double*)malloc(sizeof(double) * N);

		fit = reg_init(N, rp);

		setIntercept(fit, 1);
		regress(fit, NULL, x, res, varcovar, 0.95);

		
		coeff = (fit->beta + 0)->value;
		sigma = 10.0 * (fit->beta + 0)->stdErr;


		free(varcovar);
		free(res);
		free_reg(fit);
	}

	obj = alik_init(p, d, q, N);

	obj->N = N;
	
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}

	if (obj->M == 1) {
		b[p + q] = coeff;
	}

	obj->mean = coeff;


	for (i = 0; i < N; ++i) {
		obj->x[i] = obj->x[2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[i] = 0.0;
	}

	custom_function as154_min = { fas154, obj };
	retval = fminunc(&as154_min, NULL, pq, b,maxstep, optmethod, tf);

	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq; ++i) {
		dx[i] = 1.0;
	}

	//Check for invertibility

	if (q > 0) {
		invertroot(q,tf+p);
	}

	hessian_fd(&as154_min, tf, pq, dx, obj->eps, hess);
	
	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (length-d) * 0.5 * (hess[i] + thess[i]);
	}
	

	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);


	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	if (obj->M == 1) {
		*wmean = tf[p + q];
	}
	else {
		*wmean = 0.0;
	}
	/*
	wmean = 0.0;
	for (i = 0; i < N; ++i) {
		wmean += (obj->x[N + i] * obj->x[N + i]);
	}*/

	*var = (obj->ssq) / (double) N;
	for (i = 0; i < length - d; ++i) {
		resid[i] = obj->x[N + i];
	}
	*loglik = obj->loglik;
	//printf("MEAN %g \n", mean(obj->x+N,N));
	//mdisplay(obj->x + N, 1, N);

	free(b);
	free(tf);
	free(x);
	free(thess);
	free(ipiv);
	free(dx);
	free_alik(obj);
	return ret;
}